

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packer.c
# Opt level: O3

int packer_segment_get(uint32_t field,void *value,mixed_segment *segment)

{
  if (field == 1) {
    *(bool *)value = segment->mix == mix_noop;
  }
  else if (field == 3) {
    *(undefined4 *)value = *(undefined4 *)((long)segment->data + 0x78);
  }
  else {
    if (field != 4) {
      mixed_err(7);
      return 0;
    }
    *(undefined4 *)value = *(undefined4 *)((long)segment->data + 0x7c);
  }
  return 1;
}

Assistant:

int packer_segment_get(uint32_t field, void *value, struct mixed_segment *segment){
  struct pack_segment_data *data = (struct pack_segment_data *)segment->data;
  
  switch(field){
  case MIXED_RESAMPLE_TYPE:
    *((int *)value) = data->quality;
    return 1;
  case MIXED_VOLUME:
    *((float *)value) = data->target_volume;
    return 1;
  case MIXED_BYPASS:
    *(bool *)value = (segment->mix == mix_noop);
    return 1;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
}